

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StrpTimeFunction::Bind
          (StrpTimeFunction *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_type sVar3;
  undefined8 uVar4;
  ScalarFunction *pSVar5;
  bool bVar6;
  int iVar7;
  reference pvVar8;
  pointer pEVar9;
  type pEVar10;
  StrpTimeBindData *pSVar11;
  __normal_iterator<const_duckdb::StrTimeSpecifier_*,_std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>_>
  _Var12;
  vector<duckdb::Value,_true> *pvVar13;
  undefined8 *puVar14;
  ParameterNotResolvedException *this_00;
  InvalidInputException *pIVar15;
  code *pcVar16;
  pointer pVVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  string error;
  string format_string;
  vector<duckdb::StrpTimeFormat,_true> formats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  format_strings;
  StrpTimeFormat format;
  Value format_value;
  string local_228;
  string local_208;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  string local_1d8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_1b8;
  ScalarFunction *local_1b0;
  vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_> local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_170;
  undefined1 local_168 [16];
  _func_int *local_158 [3];
  pointer local_140;
  StrTimeSpecifier *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Value local_70;
  
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar8);
  iVar7 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[6])(pEVar9);
  if ((char)iVar7 != '\0') {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar8);
  iVar7 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
  if ((char)iVar7 == '\0') {
    pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(pvVar8);
    local_168._0_8_ = local_158;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"strptime format must be a constant","");
    InvalidInputException::InvalidInputException<>(pIVar15,pEVar10,(string *)local_168);
    __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (pvVar8);
  ExpressionExecutor::EvaluateScalar(&local_70,context,pEVar10,false);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)local_168);
  if (local_70.is_null == true) {
    pSVar11 = (StrpTimeBindData *)operator_new(0x38);
    StrpTimeBindData::StrpTimeBindData(pSVar11,(StrpTimeFormat *)local_168,&local_1d8);
    *(StrpTimeBindData **)this = pSVar11;
  }
  else if (local_70.type_.id_ == VARCHAR) {
    Value::ToString_abi_cxx11_(&local_228,&local_70);
    ::std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_assign((string *)(local_168 + 8));
    StrTimeFormat::ParseFormatSpecifier(&local_228,&local_1d8,(StrTimeFormat *)local_168);
    if ((element_type *)local_228._M_string_length != (element_type *)0x0) {
      pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(pvVar8);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,"Failed to parse format specifier %s: %s","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_1d8._M_dataplus._M_p,
                 local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_228._M_dataplus._M_p,
                 local_228._M_dataplus._M_p + local_228._M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                (pIVar15,pEVar10,&local_208,&local_90,&local_f0);
      __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_208._M_dataplus._M_p._0_1_ = 0x17;
    _Var12 = ::std::
             __find_if<__gnu_cxx::__normal_iterator<duckdb::StrTimeSpecifier_const*,std::vector<duckdb::StrTimeSpecifier,std::allocator<duckdb::StrTimeSpecifier>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::StrTimeSpecifier_const>>
                       (local_140,local_138);
    if (_Var12._M_current == local_138) {
      local_208._M_dataplus._M_p._0_1_ = 0x20;
      _Var12 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<duckdb::StrTimeSpecifier_const*,std::vector<duckdb::StrTimeSpecifier,std::allocator<duckdb::StrTimeSpecifier>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::StrTimeSpecifier_const>>
                         (local_140);
      if (_Var12._M_current != local_138) {
        LogicalType::LogicalType((LogicalType *)&local_208,TIMESTAMP_NS);
        uVar4 = local_208.field_2._M_allocated_capacity;
        sVar3 = local_208._M_string_length;
        (bound_function->super_BaseScalarFunction).return_type.id_ =
             (LogicalTypeId)local_208._M_dataplus._M_p;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             local_208._M_dataplus._M_p._1_1_;
        psVar1 = &(bound_function->super_BaseScalarFunction).return_type.type_info_;
        uVar21 = *(undefined4 *)
                  &(psVar1->internal).
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar22 = *(undefined4 *)
                  ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal
                          .super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pVVar17 = (pointer)(psVar1->internal).
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
        uVar23 = *(undefined4 *)
                  &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar24 = *(undefined4 *)
                  ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal
                          .super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_208._M_string_length = 0;
        local_208.field_2._M_allocated_capacity = 0;
        p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)sVar3;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_1e8 = pVVar17;
          uStack_1e0 = uVar23;
          uStack_1dc = uVar24;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar21 = (undefined4)local_1e8;
          uVar22 = local_1e8._4_4_;
          uVar23 = uStack_1e0;
          uVar24 = uStack_1dc;
        }
        uVar4 = local_208.field_2._M_allocated_capacity;
        local_208._M_string_length = CONCAT44(uVar22,uVar21);
        local_208.field_2._M_allocated_capacity._4_4_ = uVar24;
        local_208.field_2._M_allocated_capacity._0_4_ = uVar23;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
        LogicalType::~LogicalType((LogicalType *)&local_208);
        iVar7 = ::std::__cxx11::string::compare
                          ((char *)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                                    super_Function.name);
        if (iVar7 == 0) {
          pcVar16 = Parse<duckdb::timestamp_ns_t>;
        }
        else {
          pcVar16 = TryParse<duckdb::timestamp_ns_t>;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,pcVar16);
      }
    }
    else {
      LogicalType::LogicalType((LogicalType *)&local_208,TIMESTAMP_TZ);
      uVar4 = local_208.field_2._M_allocated_capacity;
      sVar3 = local_208._M_string_length;
      (bound_function->super_BaseScalarFunction).return_type.id_ =
           (LogicalTypeId)local_208._M_dataplus._M_p;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           local_208._M_dataplus._M_p._1_1_;
      psVar1 = &(bound_function->super_BaseScalarFunction).return_type.type_info_;
      uVar21 = *(undefined4 *)
                &(psVar1->internal).
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar22 = *(undefined4 *)
                ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      pVVar17 = (pointer)(psVar1->internal).
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
      uVar23 = *(undefined4 *)
                &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar24 = *(undefined4 *)
                ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sVar3;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_1e8 = pVVar17;
        uStack_1e0 = uVar23;
        uStack_1dc = uVar24;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        uVar21 = (undefined4)local_1e8;
        uVar22 = local_1e8._4_4_;
        uVar23 = uStack_1e0;
        uVar24 = uStack_1dc;
      }
      uVar4 = local_208.field_2._M_allocated_capacity;
      local_208._M_string_length = CONCAT44(uVar22,uVar21);
      local_208.field_2._M_allocated_capacity._4_4_ = uVar24;
      local_208.field_2._M_allocated_capacity._0_4_ = uVar23;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
      }
      LogicalType::~LogicalType((LogicalType *)&local_208);
    }
    pSVar11 = (StrpTimeBindData *)operator_new(0x38);
    StrpTimeBindData::StrpTimeBindData(pSVar11,(StrpTimeFormat *)local_168,&local_1d8);
    *(StrpTimeBindData **)this = pSVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  else {
    LogicalType::LogicalType((LogicalType *)&local_208,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_228,(LogicalType *)&local_208);
    bVar6 = LogicalType::operator==(&local_70.type_,(LogicalType *)&local_228);
    LogicalType::~LogicalType((LogicalType *)&local_228);
    LogicalType::~LogicalType((LogicalType *)&local_208);
    if (!bVar6) {
      pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(pvVar8);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"strptime format must be a string","");
      InvalidInputException::InvalidInputException<>(pIVar15,pEVar10,&local_228);
      __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar13 = ListValue::GetChildren(&local_70);
    local_1b0 = bound_function;
    if ((pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(pvVar8);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"strptime format list must not be empty","");
      InvalidInputException::InvalidInputException<>(pIVar15,pEVar10,&local_228);
      __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar6 = false;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super__Vector_base<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super__Vector_base<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar17 = (pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1e8 = (pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_1b8._M_head_impl = (FunctionData *)this;
    if (pVVar17 == local_1e8) {
      bVar20 = false;
    }
    else {
      local_170 = arguments;
      bVar19 = false;
      bVar18 = false;
      do {
        Value::ToString_abi_cxx11_(&local_228,pVVar17);
        ::std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        ::std::__cxx11::string::_M_assign((string *)(local_168 + 8));
        StrTimeFormat::ParseFormatSpecifier(&local_228,&local_1d8,(StrTimeFormat *)local_168);
        if ((element_type *)local_228._M_string_length != (element_type *)0x0) {
          pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](local_170,0);
          pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(pvVar8);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,"Failed to parse format specifier %s: %s","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_1d8._M_dataplus._M_p,
                     local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_228._M_dataplus._M_p,
                     local_228._M_dataplus._M_p + local_228._M_string_length);
          InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar15,pEVar10,&local_208,&local_b0,&local_d0);
          __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        bVar20 = true;
        bVar6 = true;
        if (!bVar19) {
          local_208._M_dataplus._M_p._0_1_ = 0x17;
          _Var12 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<duckdb::StrTimeSpecifier_const*,std::vector<duckdb::StrTimeSpecifier,std::allocator<duckdb::StrTimeSpecifier>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::StrTimeSpecifier_const>>
                             (local_140,local_138,&local_208);
          bVar6 = _Var12._M_current != local_138;
        }
        if (!bVar18) {
          local_208._M_dataplus._M_p._0_1_ = 0x20;
          _Var12 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<duckdb::StrTimeSpecifier_const*,std::vector<duckdb::StrTimeSpecifier,std::allocator<duckdb::StrTimeSpecifier>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::StrTimeSpecifier_const>>
                             (local_140,local_138,&local_208);
          bVar20 = _Var12._M_current != local_138;
        }
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
                   &local_1d8);
        ::std::vector<duckdb::StrpTimeFormat,std::allocator<duckdb::StrpTimeFormat>>::
        emplace_back<duckdb::StrpTimeFormat&>
                  ((vector<duckdb::StrpTimeFormat,std::allocator<duckdb::StrpTimeFormat>> *)
                   &local_1a8,(StrpTimeFormat *)local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        pVVar17 = pVVar17 + 1;
        bVar19 = bVar6;
        bVar18 = bVar20;
      } while (pVVar17 != local_1e8);
    }
    pSVar5 = local_1b0;
    this = (StrpTimeFunction *)local_1b8._M_head_impl;
    if (bVar6) {
      LogicalType::LogicalType((LogicalType *)&local_228,TIMESTAMP_TZ);
      this = (StrpTimeFunction *)local_1b8;
      uVar4 = local_228.field_2._M_allocated_capacity;
      sVar3 = local_228._M_string_length;
      (local_1b0->super_BaseScalarFunction).return_type.id_ =
           (LogicalTypeId)local_228._M_dataplus._M_p;
      (local_1b0->super_BaseScalarFunction).return_type.physical_type_ =
           local_228._M_dataplus._M_p._1_1_;
      psVar1 = &(local_1b0->super_BaseScalarFunction).return_type.type_info_;
      uVar21 = *(undefined4 *)
                &(psVar1->internal).
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar22 = *(undefined4 *)
                ((long)&(local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      pVVar17 = (pointer)(psVar1->internal).
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
      uVar23 = *(undefined4 *)
                &(local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar24 = *(undefined4 *)
                ((long)&(local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228._M_string_length = 0;
      local_228.field_2._M_allocated_capacity = 0;
      p_Var2 = (local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sVar3;
      (local_1b0->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_1e8 = pVVar17;
        uStack_1e0 = uVar23;
        uStack_1dc = uVar24;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        uVar21 = (undefined4)local_1e8;
        uVar22 = local_1e8._4_4_;
        uVar23 = uStack_1e0;
        uVar24 = uStack_1dc;
      }
      uVar4 = local_228.field_2._M_allocated_capacity;
      local_228._M_string_length = CONCAT44(uVar22,uVar21);
      local_228.field_2._M_allocated_capacity._4_4_ = uVar24;
      local_228.field_2._M_allocated_capacity._0_4_ = uVar23;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
      }
      LogicalType::~LogicalType((LogicalType *)&local_228);
    }
    else if (bVar20) {
      LogicalType::LogicalType((LogicalType *)&local_228,TIMESTAMP_NS);
      uVar4 = local_228.field_2._M_allocated_capacity;
      sVar3 = local_228._M_string_length;
      (pSVar5->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)local_228._M_dataplus._M_p
      ;
      (pSVar5->super_BaseScalarFunction).return_type.physical_type_ =
           local_228._M_dataplus._M_p._1_1_;
      psVar1 = &(pSVar5->super_BaseScalarFunction).return_type.type_info_;
      uVar21 = *(undefined4 *)
                &(psVar1->internal).
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar22 = *(undefined4 *)
                ((long)&(pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      pVVar17 = (pointer)(psVar1->internal).
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
      uVar23 = *(undefined4 *)
                &(pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar24 = *(undefined4 *)
                ((long)&(pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228._M_string_length = 0;
      local_228.field_2._M_allocated_capacity = 0;
      p_Var2 = (pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sVar3;
      (pSVar5->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_1e8 = pVVar17;
        uStack_1e0 = uVar23;
        uStack_1dc = uVar24;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        uVar21 = (undefined4)local_1e8;
        uVar22 = local_1e8._4_4_;
        uVar23 = uStack_1e0;
        uVar24 = uStack_1dc;
      }
      uVar4 = local_228.field_2._M_allocated_capacity;
      local_228._M_string_length = CONCAT44(uVar22,uVar21);
      local_228.field_2._M_allocated_capacity._4_4_ = uVar24;
      local_228.field_2._M_allocated_capacity._0_4_ = uVar23;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
      }
      LogicalType::~LogicalType((LogicalType *)&local_228);
      iVar7 = ::std::__cxx11::string::compare
                        ((char *)&(pSVar5->super_BaseScalarFunction).super_SimpleFunction.
                                  super_Function.name);
      if (iVar7 == 0) {
        pcVar16 = Parse<duckdb::timestamp_ns_t>;
      }
      else {
        pcVar16 = TryParse<duckdb::timestamp_ns_t>;
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 &pSVar5->function,pcVar16);
    }
    puVar14 = (undefined8 *)operator_new(0x38);
    ::std::vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>::vector
              ((vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_> *)&local_228
               ,&local_1a8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_208,&local_188);
    *puVar14 = &PTR__StrpTimeBindData_0249bb78;
    puVar14[1] = local_228._M_dataplus._M_p;
    puVar14[2] = local_228._M_string_length;
    puVar14[3] = local_228.field_2._M_allocated_capacity;
    local_228.field_2._M_allocated_capacity = 0;
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    puVar14[4] = local_208._M_dataplus._M_p;
    puVar14[5] = local_208._M_string_length;
    puVar14[6] = local_208.field_2._M_allocated_capacity;
    local_208.field_2._M_allocated_capacity = 0;
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_208);
    ::std::vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>::~vector
              ((vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_> *)&local_228
              );
    *(undefined8 **)this = puVar14;
    ::std::vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_>::~vector
              (&local_1a8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_188);
  }
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, ScalarFunction &bound_function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		if (arguments[1]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[1]->IsFoldable()) {
			throw InvalidInputException(*arguments[0], "strptime format must be a constant");
		}
		Value format_value = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		string format_string;
		StrpTimeFormat format;
		if (format_value.IsNull()) {
			return make_uniq<StrpTimeBindData>(format, format_string);
		} else if (format_value.type().id() == LogicalTypeId::VARCHAR) {
			format_string = format_value.ToString();
			format.format_specifier = format_string;
			string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
			if (!error.empty()) {
				throw InvalidInputException(*arguments[0], "Failed to parse format specifier %s: %s", format_string,
				                            error);
			}
			if (format.HasFormatSpecifier(StrTimeSpecifier::UTC_OFFSET)) {
				bound_function.return_type = LogicalType::TIMESTAMP_TZ;
			} else if (format.HasFormatSpecifier(StrTimeSpecifier::NANOSECOND_PADDED)) {
				bound_function.return_type = LogicalType::TIMESTAMP_NS;
				if (bound_function.name == "strptime") {
					bound_function.function = Parse<timestamp_ns_t>;
				} else {
					bound_function.function = TryParse<timestamp_ns_t>;
				}
			}
			return make_uniq<StrpTimeBindData>(format, format_string);
		} else if (format_value.type() == LogicalType::LIST(LogicalType::VARCHAR)) {
			const auto &children = ListValue::GetChildren(format_value);
			if (children.empty()) {
				throw InvalidInputException(*arguments[0], "strptime format list must not be empty");
			}
			vector<string> format_strings;
			vector<StrpTimeFormat> formats;
			bool has_offset = false;
			bool has_nanos = false;

			for (const auto &child : children) {
				format_string = child.ToString();
				format.format_specifier = format_string;
				string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
				if (!error.empty()) {
					throw InvalidInputException(*arguments[0], "Failed to parse format specifier %s: %s", format_string,
					                            error);
				}
				has_offset = has_offset || format.HasFormatSpecifier(StrTimeSpecifier::UTC_OFFSET);
				has_nanos = has_nanos || format.HasFormatSpecifier(StrTimeSpecifier::NANOSECOND_PADDED);
				format_strings.emplace_back(format_string);
				formats.emplace_back(format);
			}

			if (has_offset) {
				// If any format has UTC offsets, then we have to produce TSTZ
				bound_function.return_type = LogicalType::TIMESTAMP_TZ;
			} else if (has_nanos) {
				// If any format has nanoseconds, then we have to produce TSNS
				// unless there is an offset, in which case we produce
				bound_function.return_type = LogicalType::TIMESTAMP_NS;
				if (bound_function.name == "strptime") {
					bound_function.function = Parse<timestamp_ns_t>;
				} else {
					bound_function.function = TryParse<timestamp_ns_t>;
				}
			}
			return make_uniq<StrpTimeBindData>(formats, format_strings);
		} else {
			throw InvalidInputException(*arguments[0], "strptime format must be a string");
		}
	}